

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeDependencies.cpp
# Opt level: O0

void helics::generateMinTimeImplementation
               (TimeData *mTime,DependencyInfo *dep,GlobalFederateId ignore,int32_t sequenceCode)

{
  bool bVar1;
  int in_ECX;
  GlobalFederateId in_EDX;
  TimeRepresentation<count_time<9,_long>_> *in_RSI;
  TimeRepresentation<count_time<9,_long>_> *in_RDI;
  double in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  GlobalFederateId in_stack_ffffffffffffffd4;
  
  if ((byte)in_RSI[6].internalTimeCode < 5) {
    bVar1 = GlobalFederateId::operator==((GlobalFederateId *)(in_RSI + 9),in_EDX);
    if (!bVar1) {
      if ((byte)in_RSI[6].internalTimeCode < (byte)in_RDI[6].internalTimeCode) {
        *(int *)&in_RDI[5].internalTimeCode = (int)in_RSI[9].internalTimeCode;
        *(char *)&in_RDI[6].internalTimeCode = (char)in_RSI[6].internalTimeCode;
        *(byte *)((long)&in_RDI[6].internalTimeCode + 3) =
             *(byte *)((long)&in_RSI[6].internalTimeCode + 3) & 1;
        *(undefined1 *)((long)&in_RDI[6].internalTimeCode + 5) =
             *(undefined1 *)((long)&in_RSI[6].internalTimeCode + 5);
        *(undefined4 *)((long)&in_RDI[7].internalTimeCode + 4) =
             *(undefined4 *)((long)&in_RSI[7].internalTimeCode + 4);
        *(int *)&in_RDI[8].internalTimeCode = (int)in_RSI[8].internalTimeCode;
        *(byte *)((long)&in_RDI[6].internalTimeCode + 2) =
             *(byte *)((long)&in_RSI[6].internalTimeCode + 2) & 1;
      }
      else if ((char)in_RSI[6].internalTimeCode == (char)in_RDI[6].internalTimeCode) {
        if (*(byte *)((long)&in_RSI[6].internalTimeCode + 5) <
            *(byte *)((long)&in_RDI[6].internalTimeCode + 5)) {
          *(int *)&in_RDI[5].internalTimeCode = (int)in_RSI[9].internalTimeCode;
          *(byte *)((long)&in_RDI[6].internalTimeCode + 3) =
               *(byte *)((long)&in_RSI[6].internalTimeCode + 3) & 1;
          *(undefined1 *)((long)&in_RDI[6].internalTimeCode + 5) =
               *(undefined1 *)((long)&in_RSI[6].internalTimeCode + 5);
          *(undefined4 *)((long)&in_RDI[7].internalTimeCode + 4) =
               *(undefined4 *)((long)&in_RSI[7].internalTimeCode + 4);
          *(undefined4 *)&in_RDI[8].internalTimeCode =
               *(undefined4 *)((long)&in_RSI[7].internalTimeCode + 4);
          *(byte *)((long)&in_RDI[6].internalTimeCode + 2) =
               *(byte *)((long)&in_RSI[6].internalTimeCode + 2) & 1;
        }
        else if ((*(char *)((long)&in_RSI[6].internalTimeCode + 5) ==
                  *(char *)((long)&in_RDI[6].internalTimeCode + 5)) &&
                ((*(byte *)((long)&in_RSI[6].internalTimeCode + 2) & 1) !=
                 (*(byte *)((long)&in_RDI[6].internalTimeCode + 2) & 1))) {
          if ((in_RSI[6].internalTimeCode & 0x10000) == 0) {
            *(int *)&in_RDI[5].internalTimeCode = (int)in_RSI[9].internalTimeCode;
            *(byte *)((long)&in_RDI[6].internalTimeCode + 3) =
                 *(byte *)((long)&in_RSI[6].internalTimeCode + 3) & 1;
            *(undefined1 *)((long)&in_RDI[6].internalTimeCode + 5) =
                 *(undefined1 *)((long)&in_RSI[6].internalTimeCode + 5);
            *(undefined4 *)((long)&in_RDI[7].internalTimeCode + 4) =
                 *(undefined4 *)((long)&in_RSI[7].internalTimeCode + 4);
            *(undefined4 *)&in_RDI[8].internalTimeCode =
                 *(undefined4 *)((long)&in_RSI[7].internalTimeCode + 4);
            *(undefined1 *)((long)&in_RDI[6].internalTimeCode + 2) = 0;
          }
        }
        else if ((*(char *)((long)&in_RSI[6].internalTimeCode + 5) ==
                  *(char *)((long)&in_RDI[6].internalTimeCode + 5)) &&
                (bVar1 = GlobalFederateId::operator<
                                   ((GlobalFederateId *)(in_RSI + 9),
                                    (GlobalFederateId)(BaseType)in_RDI[5].internalTimeCode), bVar1))
        {
          *(int *)&in_RDI[5].internalTimeCode = (int)in_RSI[9].internalTimeCode;
          *(byte *)((long)&in_RDI[6].internalTimeCode + 3) =
               *(byte *)((long)&in_RSI[6].internalTimeCode + 3) & 1;
          *(undefined4 *)((long)&in_RDI[7].internalTimeCode + 4) =
               *(undefined4 *)((long)&in_RSI[7].internalTimeCode + 4);
          *(undefined4 *)&in_RDI[8].internalTimeCode =
               *(undefined4 *)((long)&in_RSI[7].internalTimeCode + 4);
        }
      }
      in_RDI->internalTimeCode = -1;
      in_RDI[1].internalTimeCode = 0;
      in_RDI[2].internalTimeCode = 0;
    }
  }
  else {
    bVar1 = GlobalFederateId::operator==((GlobalFederateId *)(in_RSI + 9),in_EDX);
    if (bVar1) {
      bVar1 = GlobalFederateId::isBroker((GlobalFederateId *)(in_RSI + 9));
      if ((bVar1) &&
         (bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<(in_RSI + 1,in_RDI + 2), bVar1)
         ) {
        in_RDI[2].internalTimeCode = in_RSI[1].internalTimeCode;
      }
    }
    else {
      if ((*(char *)((long)&in_RSI[9].internalTimeCode + 5) == '\x03') ||
         ((((in_ECX != 0 && ((int)in_RSI[8].internalTimeCode != in_ECX)) &&
           (*(char *)((long)&in_RSI[6].internalTimeCode + 4) != '\0')) &&
          ((in_RSI[9].internalTimeCode & 0x1000000000000) != 0)))) {
        if (((int)in_RSI[8].internalTimeCode == in_ECX) &&
           ((in_RSI[9].internalTimeCode & 0x1000000000000) != 0)) {
          bVar1 = TimeRepresentation<count_time<9,_long>_>::operator>=(in_RSI + 2,in_RSI);
          if ((bVar1) &&
             (bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<(in_RSI + 2,in_RDI + 2),
             bVar1)) {
            in_RDI[2].internalTimeCode = in_RSI[2].internalTimeCode;
          }
        }
        else {
          bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<(in_RSI,in_RDI + 2);
          if (bVar1) {
            in_RDI[2].internalTimeCode = in_RSI->internalTimeCode;
          }
        }
      }
      else {
        bVar1 = TimeRepresentation<count_time<9,_long>_>::operator>=(in_RSI + 2,in_RSI);
        if (bVar1) {
          bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<(in_RSI + 2,in_RDI + 2);
          if (bVar1) {
            in_RDI[2].internalTimeCode = in_RSI[2].internalTimeCode;
          }
        }
        else {
          TimeRepresentation<count_time<9,_long>_>::operator=
                    ((TimeRepresentation<count_time<9,_long>_> *)
                     CONCAT44(in_stack_ffffffffffffffd4.gid,in_stack_ffffffffffffffd0),
                     in_stack_ffffffffffffffc8);
        }
      }
      bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<(in_RSI,in_RDI);
      if (bVar1) {
        in_RDI->internalTimeCode = in_RSI->internalTimeCode;
        *(char *)&in_RDI[6].internalTimeCode = (char)in_RSI[6].internalTimeCode;
        if (((int)in_RSI[8].internalTimeCode == in_ECX) &&
           ((in_RSI[9].internalTimeCode & 0x1000000000000) != 0)) {
          *(byte *)((long)&in_RDI[6].internalTimeCode + 2) =
               *(byte *)((long)&in_RSI[6].internalTimeCode + 2) & 1;
        }
        else {
          *(undefined1 *)((long)&in_RDI[6].internalTimeCode + 2) = 0;
        }
      }
      else {
        bVar1 = TimeRepresentation<count_time<9,_long>_>::operator==(in_RSI,in_RDI);
        if (bVar1) {
          if ((char)in_RSI[6].internalTimeCode == '\x05') {
            *(char *)&in_RDI[6].internalTimeCode = (char)in_RSI[6].internalTimeCode;
            *(undefined1 *)((long)&in_RDI[6].internalTimeCode + 2) = 0;
          }
          else if ((in_RSI[6].internalTimeCode & 0x10000) == 0) {
            *(undefined1 *)((long)&in_RDI[6].internalTimeCode + 2) = 0;
          }
        }
      }
      bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<(in_RSI + 1,in_RDI + 1);
      if (bVar1) {
        in_RDI[3].internalTimeCode = in_RDI[1].internalTimeCode;
        in_RDI[1].internalTimeCode = in_RSI[1].internalTimeCode;
        *(int *)&in_RDI[5].internalTimeCode = (int)in_RSI[9].internalTimeCode;
        *(undefined4 *)((long)&in_RDI[7].internalTimeCode + 4) =
             *(undefined4 *)((long)&in_RSI[7].internalTimeCode + 4);
        *(undefined4 *)&in_RDI[8].internalTimeCode =
             *(undefined4 *)((long)&in_RSI[7].internalTimeCode + 4);
        bVar1 = GlobalFederateId::isValid((GlobalFederateId *)(in_RSI + 5));
        if (bVar1) {
          *(int *)((long)&in_RDI[5].internalTimeCode + 4) = (int)in_RSI[5].internalTimeCode;
        }
        else {
          *(int *)&in_RDI[5].internalTimeCode = (int)in_RSI[9].internalTimeCode;
        }
      }
      else {
        bVar1 = TimeRepresentation<count_time<9,_long>_>::operator==(in_RSI + 1,in_RDI + 1);
        if (bVar1) {
          memset(&stack0xffffffffffffffd4,0,4);
          GlobalFederateId::GlobalFederateId((GlobalFederateId *)&stack0xffffffffffffffd4);
          *(BaseType *)&in_RDI[5].internalTimeCode = in_stack_ffffffffffffffd4.gid;
          in_RDI[3].internalTimeCode = in_RDI[1].internalTimeCode;
        }
      }
    }
  }
  return;
}

Assistant:

static void generateMinTimeImplementation(TimeData& mTime,
                                          const DependencyInfo& dep,
                                          GlobalFederateId ignore,
                                          std::int32_t sequenceCode)
{
    if (dep.mTimeState < TimeState::time_granted) {
        if (dep.fedID == ignore) {
            return;
        }
        if (dep.mTimeState < mTime.mTimeState) {
            mTime.minFed = dep.fedID;
            mTime.mTimeState = dep.mTimeState;
            mTime.delayedTiming = dep.delayedTiming;
            mTime.restrictionLevel = dep.restrictionLevel;
            mTime.sequenceCounter = dep.sequenceCounter;
            mTime.responseSequenceCounter = dep.responseSequenceCounter;
            mTime.interrupted = dep.interrupted;
        } else if (dep.mTimeState == mTime.mTimeState) {
            if (dep.restrictionLevel < mTime.restrictionLevel) {
                mTime.minFed = dep.fedID;
                mTime.delayedTiming = dep.delayedTiming;
                mTime.restrictionLevel = dep.restrictionLevel;
                mTime.sequenceCounter = dep.sequenceCounter;
                mTime.responseSequenceCounter = dep.sequenceCounter;
                mTime.interrupted = dep.interrupted;
            } else if (dep.restrictionLevel == mTime.restrictionLevel &&
                       dep.interrupted != mTime.interrupted) {
                if (!dep.interrupted) {
                    mTime.minFed = dep.fedID;
                    mTime.delayedTiming = dep.delayedTiming;
                    mTime.restrictionLevel = dep.restrictionLevel;
                    mTime.sequenceCounter = dep.sequenceCounter;
                    mTime.responseSequenceCounter = dep.sequenceCounter;
                    mTime.interrupted = false;
                }
            } else if (dep.restrictionLevel == mTime.restrictionLevel && dep.fedID < mTime.minFed) {
                mTime.minFed = dep.fedID;
                mTime.delayedTiming = dep.delayedTiming;
                mTime.sequenceCounter = dep.sequenceCounter;
                mTime.responseSequenceCounter = dep.sequenceCounter;
            }
        }
        mTime.next = initializationTime;
        mTime.Te = timeZero;
        mTime.minDe = timeZero;
        return;
    }

    if (dep.fedID == ignore) {
        if (dep.fedID.isBroker()) {
            if (dep.Te < mTime.minDe) {
                mTime.minDe = dep.Te;
            }
        }

        return;
    }

    if (dep.connection != ConnectionType::SELF &&
        (sequenceCode == 0 || dep.responseSequenceCounter == sequenceCode ||
         dep.timingVersion == 0 || !dep.dependent)) {
        if (dep.minDe >= dep.next) {
            if (dep.minDe < mTime.minDe) {
                mTime.minDe = dep.minDe;
            }
        } else {
            // this minimum dependent event time received was invalid and can't be trusted
            // therefore it can't be used to determine a time grant
            mTime.minDe = -1;
        }
    } else if (dep.responseSequenceCounter == sequenceCode && dep.dependent) {
        if (dep.minDe >= dep.next && dep.minDe < mTime.minDe) {
            mTime.minDe = dep.minDe;
        }
    } else {
        if (dep.next < mTime.minDe) {
            mTime.minDe = dep.next;
        }
    }
    if (dep.next < mTime.next) {
        mTime.next = dep.next;
        mTime.mTimeState = dep.mTimeState;
        if (dep.responseSequenceCounter == sequenceCode && dep.dependent) {
            mTime.interrupted = dep.interrupted;
        } else {
            mTime.interrupted = false;
        }
    } else if (dep.next == mTime.next) {
        if (dep.mTimeState == TimeState::time_granted) {
            mTime.mTimeState = dep.mTimeState;
            mTime.interrupted = false;
        } else if (!dep.interrupted) {
            mTime.interrupted = false;
        }
    }
    // if (dep.connection != ConnectionType::self) {
    if (dep.Te < mTime.Te) {
        mTime.TeAlt = mTime.Te;
        mTime.Te = dep.Te;
        mTime.minFed = dep.fedID;
        mTime.sequenceCounter = dep.sequenceCounter;
        mTime.responseSequenceCounter = dep.sequenceCounter;

        if (dep.minFed.isValid()) {
            mTime.minFedActual = dep.minFed;
        } else {
            mTime.minFed = dep.fedID;
        }
    } else if (dep.Te == mTime.Te) {
        mTime.minFed = GlobalFederateId{};
        mTime.TeAlt = mTime.Te;
    }
    // }
}